

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# chess.cpp
# Opt level: O0

void __thiscall
banksia::ChessBoard::genLegalOnly
          (ChessBoard *this,vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_> *moveList,
          Side attackerSide)

{
  bool bVar1;
  undefined4 in_EDX;
  undefined8 in_RSI;
  value_type *in_RDI;
  MoveFull *move;
  iterator __end1;
  iterator __begin1;
  vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_> *__range1;
  Hist hist;
  vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_> moves;
  vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_> *in_stack_fffffffffffffef8;
  undefined7 in_stack_ffffffffffffff00;
  byte in_stack_ffffffffffffff07;
  reference in_stack_ffffffffffffff10;
  __normal_iterator<banksia::MoveFull_*,_std::vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>_>
  local_e0 [4];
  undefined1 local_c0 [88];
  vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_> *in_stack_ffffffffffffff98;
  vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_> *in_stack_ffffffffffffffa0;
  
  (**(code **)(*(long *)&in_RDI->super_Move + 0x88))(in_RDI,in_RSI,in_EDX);
  std::vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>::vector
            ((vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_> *)0x1e9003);
  Hist::Hist((Hist *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
  local_e0[0]._M_current =
       (MoveFull *)
       std::vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>::begin
                 (in_stack_fffffffffffffef8);
  std::vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>::end(in_stack_fffffffffffffef8)
  ;
  while( true ) {
    bVar1 = __gnu_cxx::operator!=
                      ((__normal_iterator<banksia::MoveFull_*,_std::vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>_>
                        *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00),
                       (__normal_iterator<banksia::MoveFull_*,_std::vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>_>
                        *)in_stack_fffffffffffffef8);
    if (!bVar1) break;
    in_stack_ffffffffffffff10 =
         __gnu_cxx::
         __normal_iterator<banksia::MoveFull_*,_std::vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>_>
         ::operator*(local_e0);
    (**(code **)(*(long *)&in_RDI->super_Move + 0xa8))(in_RDI,in_stack_ffffffffffffff10,local_c0);
    in_stack_ffffffffffffff07 = (**(code **)(*(long *)&in_RDI->super_Move + 0x98))(in_RDI,in_EDX);
    if ((in_stack_ffffffffffffff07 & 1) == 0) {
      std::vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>::push_back
                ((vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_> *)
                 in_stack_ffffffffffffff10,in_RDI);
    }
    (**(code **)(*(long *)&in_RDI->super_Move + 0xb0))(in_RDI,local_c0);
    __gnu_cxx::
    __normal_iterator<banksia::MoveFull_*,_std::vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>_>
    ::operator++(local_e0);
  }
  std::vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>::operator=
            (in_stack_ffffffffffffffa0,in_stack_ffffffffffffff98);
  Hist::~Hist((Hist *)CONCAT17(in_stack_ffffffffffffff07,in_stack_ffffffffffffff00));
  std::vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_>::~vector
            ((vector<banksia::MoveFull,_std::allocator<banksia::MoveFull>_> *)
             in_stack_ffffffffffffff10);
  return;
}

Assistant:

void ChessBoard::genLegalOnly(std::vector<MoveFull>& moveList, Side attackerSide) {
    gen(moveList, attackerSide);
    
    std::vector<MoveFull> moves;
    Hist hist;
    for (auto && move : moveList) {
        make(move, hist);
        if (!isIncheck(attackerSide)) {
            moves.push_back(move);
        }
        takeBack(hist);
    }
    moveList = moves;
}